

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O0

Hop_Obj_t * Abc_MfsConvertAigToHop(Aig_Man_t *pMan,Hop_Man_t *pHop)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar2;
  Hop_Obj_t *pHVar3;
  void *pvVar4;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pRoot;
  Hop_Man_t *pHop_local;
  Aig_Man_t *pMan_local;
  
  iVar1 = Aig_ManCoNum(pMan);
  if (iVar1 != 1) {
    __assert_fail("Aig_ManCoNum(pMan) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                  ,0x47,"Hop_Obj_t *Abc_MfsConvertAigToHop(Aig_Man_t *, Hop_Man_t *)");
  }
  pObj_00 = Aig_ManCo(pMan,0);
  pAVar2 = Aig_ObjFanin0(pObj_00);
  iVar1 = Aig_ObjIsConst1(pAVar2);
  if (iVar1 == 0) {
    Aig_ManCleanData(pMan);
    for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar4 = Vec_PtrEntry(pMan->vCis,local_34);
      pHVar3 = Hop_IthVar(pHop,local_34);
      *(Hop_Obj_t **)((long)pvVar4 + 0x28) = pHVar3;
    }
    pAVar2 = Aig_ObjFanin0(pObj_00);
    Abc_MfsConvertAigToHop_rec(pAVar2,pHop);
    pAVar2 = Aig_ObjFanin0(pObj_00);
    pHVar3 = (Hop_Obj_t *)(pAVar2->field_5).pData;
    iVar1 = Aig_ObjFaninC0(pObj_00);
    pMan_local = (Aig_Man_t *)Hop_NotCond(pHVar3,iVar1);
  }
  else {
    pHVar3 = Hop_ManConst1(pHop);
    iVar1 = Aig_ObjFaninC0(pObj_00);
    pMan_local = (Aig_Man_t *)Hop_NotCond(pHVar3,iVar1);
  }
  return (Hop_Obj_t *)pMan_local;
}

Assistant:

Hop_Obj_t * Abc_MfsConvertAigToHop( Aig_Man_t * pMan, Hop_Man_t * pHop )
{
    Aig_Obj_t * pRoot, * pObj;
    int i;
    assert( Aig_ManCoNum(pMan) == 1 );
    pRoot = Aig_ManCo( pMan, 0 );
    // check the case of a constant
    if ( Aig_ObjIsConst1( Aig_ObjFanin0(pRoot) ) )
        return Hop_NotCond( Hop_ManConst1(pHop), Aig_ObjFaninC0(pRoot) );
    // set the PI mapping
    Aig_ManCleanData( pMan );
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pData = Hop_IthVar( pHop, i );
    // construct the AIG
    Abc_MfsConvertAigToHop_rec( Aig_ObjFanin0(pRoot), pHop );
    return Hop_NotCond( (Hop_Obj_t *)Aig_ObjFanin0(pRoot)->pData, Aig_ObjFaninC0(pRoot) );
}